

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O2

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  int iVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  AActor *pAVar6;
  PClassActor *pPVar7;
  AInventory *pAVar8;
  AWeapon *pAVar9;
  AAmmo *pAVar10;
  PClass *pPVar11;
  AAmmo *ammo;
  TObjPtr<AAmmo> *pTVar12;
  
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)&this->prev);
  if (pAVar6 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar4 = false;
  }
  else {
    bVar4 = ((byte)dmflags.Value & 4) == 0;
  }
  bVar3 = DObject::IsKindOf((DObject *)item,AWeapon::RegistrationInfo.MyClass);
  if (bVar3) {
    pAVar2 = this->player->mo;
    pPVar7 = (PClassActor *)DObject::GetClass((DObject *)item);
    pAVar8 = AActor::FindInventory(&pAVar2->super_AActor,pPVar7,false);
    pAVar9 = dyn_cast<AWeapon>((DObject *)pAVar8);
    if (pAVar9 != (AWeapon *)0x0) {
      if (!bVar4) {
        return;
      }
      pTVar12 = &pAVar9->Ammo1;
      pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
      if (pAVar10 != (AAmmo *)0x0) {
        pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
        iVar1 = (pAVar10->super_AInventory).Amount;
        pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
        if (iVar1 < (pAVar10->super_AInventory).MaxAmount) goto LAB_0036c1fe;
      }
      pTVar12 = &pAVar9->Ammo2;
      pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
      if (pAVar10 == (AAmmo *)0x0) {
        return;
      }
      pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
      iVar1 = (pAVar10->super_AInventory).Amount;
      pAVar10 = GC::ReadBarrier<AAmmo>((AAmmo **)pTVar12);
      if ((pAVar10->super_AInventory).MaxAmount <= iVar1) {
        return;
      }
    }
    goto LAB_0036c1fe;
  }
  bVar4 = DObject::IsKindOf((DObject *)item,AAmmo::RegistrationInfo.MyClass);
  if (bVar4) {
    pPVar7 = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar8 = AActor::FindInventory(&this->player->mo->super_AActor,pPVar7,false);
    if ((pAVar8 != (AInventory *)0x0) && (pAVar8->MaxAmount <= pAVar8->Amount)) {
      return;
    }
    goto LAB_0036c1fe;
  }
  pPVar11 = PClass::FindClass("Megasphere");
  bVar4 = DObject::IsKindOf((DObject *)item,pPVar11);
  if (bVar4) {
LAB_0036c1ac:
    if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
      return;
    }
  }
  else {
    pPVar11 = PClass::FindClass("Soulsphere");
    bVar4 = DObject::IsKindOf((DObject *)item,pPVar11);
    if (bVar4) goto LAB_0036c1ac;
    pPVar11 = PClass::FindClass("HealthBonus");
    bVar4 = DObject::IsKindOf((DObject *)item,pPVar11);
    if (bVar4) goto LAB_0036c1ac;
  }
  bVar4 = DObject::IsKindOf((DObject *)item,AHealth::RegistrationInfo.MyClass);
  if ((bVar4) &&
     (pAVar2 = this->player->mo, iVar1 = (pAVar2->super_AActor).health,
     iVar5 = APlayerPawn::GetMaxHealth(pAVar2),
     iVar5 + (this->player->mo->super_AActor).stamina <= iVar1)) {
    return;
  }
LAB_0036c1fe:
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)&this->dest);
  if ((pAVar6 == (AActor *)0x0) ||
     (pAVar6 = GC::ReadBarrier<AActor>((AActor **)&this->dest), ((pAVar6->flags).Value & 1) == 0)) {
    (this->prev).field_0 = (this->dest).field_0;
    (this->dest).field_0.p = item;
    this->t_roam = 0x8c;
  }
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= player->mo->GetMaxHealth() + player->mo->stamina)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}